

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,Arena *arena)

{
  Arena *in_RSI;
  DescriptorProto *in_RDI;
  Arena *in_stack_ffffffffffffff78;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *in_stack_ffffffffffffff80;
  DescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffff80);
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_008d85c0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x4f3f41);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::RepeatedPtrField
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (DescriptorProto *)&in_RDI->reserved_name_;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,in_stack_ffffffffffffff78);
  SharedCtor(this_00);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

DescriptorProto::DescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  field_(arena),
  nested_type_(arena),
  enum_type_(arena),
  extension_range_(arena),
  extension_(arena),
  oneof_decl_(arena),
  reserved_range_(arena),
  reserved_name_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.DescriptorProto)
}